

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O2

void Js::CacheOperators::TraceCache
               (InlineCache *inlineCache,char16 *methodName,PropertyId propertyId,
               ScriptContext *requestContext,RecyclableObject *object)

{
  TraceCacheCommon(methodName,propertyId,requestContext,object);
  if (inlineCache != (InlineCache *)0x0) {
    Output::Print(L"Inline Cache: \n  ");
    InlineCache::Dump(inlineCache);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void CacheOperators::TraceCache(InlineCache * inlineCache, const char16 * methodName, PropertyId propertyId, ScriptContext * requestContext, RecyclableObject * object)
    {
        TraceCacheCommon(methodName, propertyId, requestContext, object);
        if(inlineCache)
        {
            Output::Print(_u("Inline Cache: \n  "));
            inlineCache->Dump();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }